

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O3

void __thiscall
slang::IntervalMap<unsigned_long,_std::monostate,_0U>::iterator::eraseNode
          (iterator *this,uint32_t level,allocator_type *alloc)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  uint32_t uVar3;
  FreeNode *pFVar4;
  IntervalMap<unsigned_long,_std::monostate,_0U> *__s;
  undefined8 uVar5;
  FreeNode *pFVar6;
  uint32_t end;
  uint uVar7;
  pointer pEVar8;
  uint level_00;
  ulong uVar9;
  
  level_00 = level - 1;
  if (level_00 == 0) {
    __s = (this->super_const_iterator).map;
    pEVar8 = (this->super_const_iterator).path.path.
             super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
    uVar7 = pEVar8->offset;
    uVar3 = __s->rootSize;
    if (uVar3 != uVar7 + 1) {
      do {
        uVar9 = (ulong)uVar7;
        uVar7 = uVar7 + 1;
        *(undefined8 *)((long)&__s->field_0 + uVar9 * 8) =
             *(undefined8 *)((long)&__s->field_0 + (ulong)uVar7 * 8);
        puVar1 = (undefined8 *)((long)&__s->field_0 + (ulong)uVar7 * 0x10 + 0x40);
        uVar5 = puVar1[1];
        puVar2 = (undefined8 *)((long)&__s->field_0 + uVar9 * 0x10 + 0x40);
        *puVar2 = *puVar1;
        puVar2[1] = uVar5;
      } while (uVar3 - 1 != uVar7);
      pEVar8 = (this->super_const_iterator).path.path.
               super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
      uVar7 = __s->rootSize - 1;
    }
    __s->rootSize = uVar7;
    pEVar8->size = uVar7;
    if (uVar7 == 0) {
      memset(__s,0,0xc4);
      const_iterator::setRoot(&this->super_const_iterator,0);
      return;
    }
  }
  else {
    pEVar8 = (this->super_const_iterator).path.path.
             super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
    pFVar4 = (FreeNode *)pEVar8[level_00].node;
    uVar3 = pEVar8[level_00].size;
    if (uVar3 == 1) {
      pFVar4->next = alloc->freeList;
      alloc->freeList = pFVar4;
      eraseNode(this,level_00,alloc);
    }
    else {
      uVar7 = pEVar8[level_00].offset;
      if (uVar3 != uVar7 + 1) {
        do {
          uVar9 = (ulong)uVar7;
          uVar7 = uVar7 + 1;
          pFVar4[uVar9].next = pFVar4[uVar7].next;
          pFVar6 = (pFVar4 + (ulong)uVar7 * 2 + 8)[1].next;
          pFVar4[uVar9 * 2 + 8].next = pFVar4[(ulong)uVar7 * 2 + 8].next;
          (pFVar4 + uVar9 * 2 + 8)[1].next = pFVar6;
        } while (uVar3 - 1 != uVar7);
        pEVar8 = (this->super_const_iterator).path.path.
                 super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
      }
      pEVar8[level_00].size = uVar3 - 1;
      *(ulong *)((long)pEVar8[level - 2].node + (ulong)pEVar8[level - 2].offset * 8) =
           *(ulong *)((long)pEVar8[level - 2].node + (ulong)pEVar8[level - 2].offset * 8) &
           0xffffffffffffffc0 | (ulong)(uVar3 - 2);
      recomputeBounds(this,level_00);
    }
  }
  if (((this->super_const_iterator).path.path.
       super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len != 0) &&
     (pEVar8 = (this->super_const_iterator).path.path.
               super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_,
     pEVar8->offset < pEVar8->size)) {
    uVar9 = *(ulong *)((long)pEVar8[level_00].node + (ulong)pEVar8[level_00].offset * 8);
    pEVar8[level].node = (void *)(uVar9 & 0xffffffffffffffc0);
    pEVar8[level].size = ((uint)uVar9 & 0x3f) + 1;
    (this->super_const_iterator).path.path.
    super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_[level].offset = 0;
  }
  return;
}

Assistant:

void IntervalMap<TKey, TValue, N>::iterator::eraseNode(uint32_t level, allocator_type& alloc) {
    SLANG_ASSERT(level > 0);
    auto& map = *this->map;
    auto& path = this->path;

    if (--level == 0) {
        uint32_t offset = path.offset(0);
        map.rootBranch.erase(offset, offset + 1, map.rootSize);
        path.setSize(0, --map.rootSize);
        if (map.empty()) {
            map.switchToLeaf();
            this->setRoot(0);
            return;
        }
    }
    else {
        auto& parent = path.template node<Branch>(level);
        if (path.size(level) == 1) {
            // Branch node became empty, remove it recursively.
            alloc.destroy(&parent);
            eraseNode(level, alloc);
        }
        else {
            // N.B. see note about updating parent bounds in erase()
            uint32_t offset = path.offset(level);
            uint32_t size = path.size(level);
            parent.erase(offset, offset + 1, size);
            path.setSize(level, size - 1);
            recomputeBounds(level);
        }
    }

    if (path.valid()) {
        path.reset(level + 1);
        path.offset(level + 1) = 0;
    }
}